

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ModuleDestroy(void *pCtx)

{
  long lVar1;
  long in_RDI;
  Fts5Global *pGlobal;
  Fts5Auxiliary *pNextAux;
  Fts5Auxiliary *pAux;
  Fts5TokenizerModule *pNextTok;
  Fts5TokenizerModule *pTok;
  undefined8 local_20;
  undefined8 local_10;
  
  local_20 = *(long *)(in_RDI + 0x40);
  while (local_20 != 0) {
    lVar1 = *(long *)(local_20 + 0x28);
    if (*(long *)(local_20 + 0x20) != 0) {
      (**(code **)(local_20 + 0x20))(*(undefined8 *)(local_20 + 0x10));
    }
    sqlite3_free((void *)0x265351);
    local_20 = lVar1;
  }
  local_10 = *(long *)(in_RDI + 0x48);
  while (local_10 != 0) {
    lVar1 = *(long *)(local_10 + 0x58);
    if (*(long *)(local_10 + 0x50) != 0) {
      (**(code **)(local_10 + 0x50))(*(undefined8 *)(local_10 + 8));
    }
    sqlite3_free((void *)0x2653ab);
    local_10 = lVar1;
  }
  sqlite3_free((void *)0x2653c1);
  return;
}

Assistant:

static void fts5ModuleDestroy(void *pCtx){
  Fts5TokenizerModule *pTok, *pNextTok;
  Fts5Auxiliary *pAux, *pNextAux;
  Fts5Global *pGlobal = (Fts5Global*)pCtx;

  for(pAux=pGlobal->pAux; pAux; pAux=pNextAux){
    pNextAux = pAux->pNext;
    if( pAux->xDestroy ) pAux->xDestroy(pAux->pUserData);
    sqlite3_free(pAux);
  }

  for(pTok=pGlobal->pTok; pTok; pTok=pNextTok){
    pNextTok = pTok->pNext;
    if( pTok->xDestroy ) pTok->xDestroy(pTok->pUserData);
    sqlite3_free(pTok);
  }

  sqlite3_free(pGlobal);
}